

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack8(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  uint uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar14 [64];
  
  if (0x1f < bs + 0x1f) {
    uVar7 = bs + 0x1f >> 5;
    lVar6 = 0;
    auVar19._8_8_ = 0x800000010;
    auVar19._0_8_ = 0x800000010;
    auVar2 = vpshufd_avx(auVar19,0x50);
    auVar9 = vpmovsxbd_avx512f(_DAT_001966a0);
    auVar10 = vpmovsxbd_avx512f(_DAT_001966b0);
    auVar11 = vbroadcasti32x4_avx512f(_DAT_00196680);
    auVar12 = vbroadcasti32x4_avx512f(_DAT_00196690);
    do {
      uVar1 = *(undefined4 *)((long)in + lVar6);
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar8 = vpbroadcastd_avx512vl();
      auVar13 = vpbroadcastd_avx512f();
      auVar3 = vpsrlvd_avx2(auVar13._0_16_,auVar19);
      auVar13 = vpbroadcastd_avx512f();
      auVar4 = vpsrlvd_avx2(auVar13._0_16_,auVar19);
      auVar5 = vpsrlvd_avx2(auVar20,auVar2);
      auVar5 = vpblendd_avx2(auVar5,auVar20,1);
      auVar13 = vinserti32x8_avx512dq(ZEXT1664(auVar19),auVar8,0);
      auVar20 = vpsrlvd_avx2(auVar8._0_16_,auVar2);
      auVar8._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar19;
      auVar8._16_16_ = ZEXT116(1) * auVar20;
      auVar8 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar13._16_4_,auVar5)),auVar8,0x60);
      auVar13 = vpbroadcastd_avx512f();
      auVar13 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar13._32_4_,auVar8)),auVar9,ZEXT1664(auVar3))
      ;
      auVar14 = vpbroadcastd_avx512f();
      auVar15._0_48_ = auVar13._0_48_;
      auVar15._48_4_ = auVar14._48_4_;
      auVar15._52_4_ = auVar13._52_4_;
      auVar15._56_4_ = auVar13._56_4_;
      auVar15._60_4_ = auVar13._60_4_;
      auVar13 = vmovdqa64_avx512f(auVar15);
      auVar13 = vpermt2d_avx512f(auVar13,auVar10,ZEXT1664(auVar4));
      auVar13 = vpandd_avx512f(auVar13,auVar12);
      auVar14 = vpsrlvd_avx512f(auVar15,auVar11);
      auVar16._0_4_ = auVar14._0_4_;
      auVar16._4_4_ = auVar13._4_4_;
      auVar16._8_4_ = auVar13._8_4_;
      auVar16._12_4_ = auVar13._12_4_;
      auVar16._16_4_ = auVar14._16_4_;
      auVar16._20_4_ = auVar13._20_4_;
      auVar16._24_4_ = auVar13._24_4_;
      auVar16._28_4_ = auVar13._28_4_;
      auVar16._32_4_ = auVar14._32_4_;
      auVar16._36_4_ = auVar13._36_4_;
      auVar16._40_4_ = auVar13._40_4_;
      auVar16._44_4_ = auVar13._44_4_;
      auVar16._48_4_ = auVar14._48_4_;
      auVar16._52_4_ = auVar13._52_4_;
      auVar16._56_4_ = auVar13._56_4_;
      auVar16._60_4_ = auVar13._60_4_;
      auVar13 = vmovdqu64_avx512f(auVar16);
      *(undefined1 (*) [64])(out + lVar6) = auVar13;
      uVar1 = *(undefined4 *)((long)in + lVar6 + 0x10);
      auVar21._4_4_ = uVar1;
      auVar21._0_4_ = uVar1;
      auVar21._8_4_ = uVar1;
      auVar21._12_4_ = uVar1;
      auVar8 = vpbroadcastd_avx512vl();
      auVar13 = vpbroadcastd_avx512f();
      auVar3 = vpsrlvd_avx2(auVar13._0_16_,auVar19);
      auVar13 = vpbroadcastd_avx512f();
      auVar4 = vpsrlvd_avx2(auVar13._0_16_,auVar19);
      auVar5 = vpsrlvd_avx2(auVar21,auVar2);
      auVar5 = vpblendd_avx2(auVar5,auVar21,1);
      auVar13 = vinserti32x8_avx512dq(ZEXT1664(auVar19),auVar8,0);
      auVar20 = vpsrlvd_avx2(auVar8._0_16_,auVar2);
      auVar22._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar19;
      auVar22._16_16_ = ZEXT116(1) * auVar20;
      auVar8 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar13._16_4_,auVar5)),auVar22,0x60);
      auVar13 = vpbroadcastd_avx512f();
      auVar13 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar13._32_4_,auVar8)),auVar9,ZEXT1664(auVar3))
      ;
      auVar14 = vpbroadcastd_avx512f();
      auVar17._0_48_ = auVar13._0_48_;
      auVar17._48_4_ = auVar14._48_4_;
      auVar17._52_4_ = auVar13._52_4_;
      auVar17._56_4_ = auVar13._56_4_;
      auVar17._60_4_ = auVar13._60_4_;
      auVar13 = vmovdqa64_avx512f(auVar17);
      auVar13 = vpermt2d_avx512f(auVar13,auVar10,ZEXT1664(auVar4));
      auVar13 = vpandd_avx512f(auVar13,auVar12);
      auVar14 = vpsrlvd_avx512f(auVar17,auVar11);
      auVar18._0_4_ = auVar14._0_4_;
      auVar18._4_4_ = auVar13._4_4_;
      auVar18._8_4_ = auVar13._8_4_;
      auVar18._12_4_ = auVar13._12_4_;
      auVar18._16_4_ = auVar14._16_4_;
      auVar18._20_4_ = auVar13._20_4_;
      auVar18._24_4_ = auVar13._24_4_;
      auVar18._28_4_ = auVar13._28_4_;
      auVar18._32_4_ = auVar14._32_4_;
      auVar18._36_4_ = auVar13._36_4_;
      auVar18._40_4_ = auVar13._40_4_;
      auVar18._44_4_ = auVar13._44_4_;
      auVar18._48_4_ = auVar14._48_4_;
      auVar18._52_4_ = auVar13._52_4_;
      auVar18._56_4_ = auVar13._56_4_;
      auVar18._60_4_ = auVar13._60_4_;
      auVar13 = vmovdqu64_avx512f(auVar18);
      *(undefined1 (*) [64])(out + lVar6 + 0x10) = auVar13;
      lVar6 = lVar6 + 0x20;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack8(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 8, --bs) {
    out[0] = in[0] >> 24;
    out[1] = (in[0] >> 16) & 0xff;
    out[2] = (in[0] >> 8) & 0xff;
    out[3] = in[0] & 0xff;
    out[4] = in[1] >> 24;
    out[5] = (in[1] >> 16) & 0xff;
    out[6] = (in[1] >> 8) & 0xff;
    out[7] = in[1] & 0xff;
    out[8] = in[2] >> 24;
    out[9] = (in[2] >> 16) & 0xff;
    out[10] = (in[2] >> 8) & 0xff;
    out[11] = in[2] & 0xff;
    out[12] = in[3] >> 24;
    out[13] = (in[3] >> 16) & 0xff;
    out[14] = (in[3] >> 8) & 0xff;
    out[15] = in[3] & 0xff;
    out[16] = in[4] >> 24;
    out[17] = (in[4] >> 16) & 0xff;
    out[18] = (in[4] >> 8) & 0xff;
    out[19] = in[4] & 0xff;
    out[20] = in[5] >> 24;
    out[21] = (in[5] >> 16) & 0xff;
    out[22] = (in[5] >> 8) & 0xff;
    out[23] = in[5] & 0xff;
    out[24] = in[6] >> 24;
    out[25] = (in[6] >> 16) & 0xff;
    out[26] = (in[6] >> 8) & 0xff;
    out[27] = in[6] & 0xff;
    out[28] = in[7] >> 24;
    out[29] = (in[7] >> 16) & 0xff;
    out[30] = (in[7] >> 8) & 0xff;
    out[31] = in[7] & 0xff;
  }
}